

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O1

void * matras_allocator_alloc(matras_allocator *allocator)

{
  undefined8 *puVar1;
  void *pvVar2;
  
  if (0 < allocator->num_reserved_extents) {
    puVar1 = (undefined8 *)allocator->reserved_extents;
    allocator->reserved_extents = (void *)*puVar1;
    allocator->num_reserved_extents = allocator->num_reserved_extents + -1;
    return puVar1;
  }
  pvVar2 = (*allocator->alloc_func)(allocator);
  return pvVar2;
}

Assistant:

void *
matras_allocator_alloc(struct matras_allocator *allocator)
{
	if (allocator->num_reserved_extents > 0) {
		void *ext = allocator->reserved_extents;
		allocator->reserved_extents = *(void **)ext;
		allocator->num_reserved_extents--;
		return ext;
	}
	return allocator->alloc_func(allocator);
}